

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ostream * smf::MidiFile::writeBigEndianDouble(ostream *out,double value)

{
  std::operator<<(out,(char)((ulong)value >> 0x38));
  std::operator<<(out,(char)((ulong)value >> 0x30));
  std::operator<<(out,(char)((ulong)value >> 0x28));
  std::operator<<(out,(char)((ulong)value >> 0x20));
  std::operator<<(out,(char)((ulong)value >> 0x18));
  std::operator<<(out,(char)((ulong)value >> 0x10));
  std::operator<<(out,(char)((ulong)value >> 8));
  std::operator<<(out,SUB81(value,0));
  return out;
}

Assistant:

std::ostream& MidiFile::writeBigEndianDouble(std::ostream& out, double value) {
	union { char bytes[8]; double d; } data;
	data.d = value;
	out << data.bytes[7];
	out << data.bytes[6];
	out << data.bytes[5];
	out << data.bytes[4];
	out << data.bytes[3];
	out << data.bytes[2];
	out << data.bytes[1];
	out << data.bytes[0];
	return out;
}